

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

confirm * __thiscall lest::confirm::operator()(confirm *this,test *testing)

{
  pointer pcVar1;
  ostream *os;
  message *e;
  undefined1 auVar2 [12];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  text local_48;
  
  this->selected = this->selected + 1;
  pcVar1 = (testing->name)._M_dataplus._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + (testing->name)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->output).ctx);
  std::__cxx11::string::_M_assign((string *)&(this->output).testing);
  if ((testing->behaviour).super__Function_base._M_manager == (_Manager_type)0x0) {
    auVar2 = std::__throw_bad_function_call();
    if (auVar2._8_4_ != 1) {
      _Unwind_Resume(auVar2._0_8_);
    }
    e = (message *)__cxa_begin_catch(auVar2._0_8_);
    this->failures = this->failures + 1;
    os = (this->super_action).os;
    env::context_abi_cxx11_(&local_48,&this->output);
    report(os,e,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    __cxa_end_catch();
  }
  else {
    (*(testing->behaviour)._M_invoker)((_Any_data *)&testing->behaviour,&this->output);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  return this;
}

Assistant:

confirm & operator()( test testing )
    {
        try
        {
            ++selected; testing.behaviour( output( testing.name ) );
        }
        catch( message const & e )
        {
            ++failures; report( os, e, output.context() );
        }
        return *this;
    }